

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64func.cpp
# Opt level: O0

RegType asmjit::_abi_1_10::a64::FuncInternal::regTypeFromFpOrVecTypeId(TypeId typeId)

{
  bool bVar1;
  char in_DIL;
  undefined1 local_1;
  
  if (in_DIL == '*') {
    local_1 = kARM_VecS;
  }
  else if (in_DIL == '+') {
    local_1 = kARM_VecD;
  }
  else {
    bVar1 = TypeUtils::isVec32(kVoid);
    if (bVar1) {
      local_1 = kARM_VecS;
    }
    else {
      bVar1 = TypeUtils::isVec64(kVoid);
      if (bVar1) {
        local_1 = kARM_VecD;
      }
      else {
        bVar1 = TypeUtils::isVec128(kVoid);
        if (bVar1) {
          local_1 = kARM_VecV;
        }
        else {
          local_1 = kNone;
        }
      }
    }
  }
  return local_1;
}

Assistant:

static RegType regTypeFromFpOrVecTypeId(TypeId typeId) noexcept {
  if (typeId == TypeId::kFloat32)
    return RegType::kARM_VecS;
  else if (typeId == TypeId::kFloat64)
    return RegType::kARM_VecD;
  else if (TypeUtils::isVec32(typeId))
    return RegType::kARM_VecS;
  else if (TypeUtils::isVec64(typeId))
    return RegType::kARM_VecD;
  else if (TypeUtils::isVec128(typeId))
    return RegType::kARM_VecV;
  else
    return RegType::kNone;
}